

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O2

double __thiscall Benchmark::getDeletionsTime(Benchmark *this,unsigned_long deletions)

{
  clock_t cVar1;
  clock_t cVar2;
  DynamicGraph *this_00;
  DynamicGraph *pDVar3;
  pointer peVar4;
  vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  edges;
  _Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  local_78;
  double local_58;
  unsigned_long local_50;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_48;
  
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start =
       (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish =
       (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0;
  this_00 = &this->G;
  pDVar3 = this_00;
  do {
    pDVar3 = *(DynamicGraph **)
              &(pDVar3->super_UndirectedGraph).super_type.m_edges.
               super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
               ._M_impl._M_node.super__List_node_base;
    if (pDVar3 == this_00) break;
    local_48.m_eproperty =
         &(pDVar3->super_UndirectedGraph).super_type.m_vertices.
          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         (pDVar3->super_UndirectedGraph).super_type.m_edges.
         super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
         ._M_impl._M_node._M_size;
    local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         (unsigned_long)
         (pDVar3->super_UndirectedGraph).super_type.m_vertices.
         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
         ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
    ::emplace_back<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>
              ((vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                *)&local_78,&local_48);
    deletions = deletions - 1;
  } while (deletions != 0);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>*,std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>>>
            ((__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
              )local_78._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
              )local_78._M_impl.super__Vector_impl_data._M_finish);
  cVar1 = clock();
  for (peVar4 = local_78._M_impl.super__Vector_impl_data._M_start;
      peVar4 != local_78._M_impl.super__Vector_impl_data._M_finish; peVar4 = peVar4 + 1) {
    local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         (peVar4->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
    local_50 = (peVar4->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target;
    DynamicGraph::deleteEdge(this_00,(Vertex *)&local_48,&local_50);
  }
  cVar2 = clock();
  local_58 = (double)(cVar2 - cVar1) / 1000000.0;
  std::
  _Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::~_Vector_base(&local_78);
  return local_58;
}

Assistant:

double Benchmark::getDeletionsTime(unsigned long deletions)
{
    int deletionsCount = 0;
    std::vector<Edge> edges;

    // get deletions number of edges
    EdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei) {
        edges.push_back(*ei);
        deletionsCount++;
        if (deletionsCount==deletions) {
            break;
        }
    }

    // shuffle them
    std::random_shuffle(edges.begin(), edges.end());

    clock_t begin = clock();
    for(auto e = edges.begin(); e!=edges.end(); ++e) {
        G.deleteEdge(boost::source(*e, G), boost::target(*e, G));
    }
    clock_t end = clock();
    double elapsed_secs = double(end-begin) / CLOCKS_PER_SEC;
    return elapsed_secs;
}